

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QKmsPlane>::relocate
          (QArrayDataPointer<QKmsPlane> *this,qsizetype offset,QKmsPlane **data)

{
  bool bVar1;
  long n;
  QKmsPlane *in_RDX;
  long in_RSI;
  QKmsPlane *in_RDI;
  QKmsPlane **unaff_retaddr;
  QKmsPlane *res;
  QKmsPlane *c;
  
  n = *(long *)&in_RDI->possibleCrtcs + in_RSI * 0x68;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QKmsPlane,long_long>(in_RDX,n,in_RDI);
  if ((in_RDX != (QKmsPlane *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QKmsPlane>,QKmsPlane_const*>
                        (unaff_retaddr,(QArrayDataPointer<QKmsPlane> *)c), bVar1)) {
    *(long *)in_RDX = in_RSI * 0x68 + *(long *)in_RDX;
  }
  *(long *)&in_RDI->possibleCrtcs = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }